

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTTPServer.hpp
# Opt level: O3

ssize_t __thiscall
webfront::http::
Connection<webfront::networking::TCPNetworkingTS,_webfront::fs::Multi<webfront::fs::NativeDebugFS,_webfront::fs::IndexFS,_webfront::fs::ReactFS,_webfront::fs::BabelFS>_>
::write(Connection<webfront::networking::TCPNetworkingTS,_webfront::fs::Multi<webfront::fs::NativeDebugFS,_webfront::fs::IndexFS,_webfront::fs::ReactFS,_webfront::fs::BabelFS>_>
        *this,int __fd,void *__buf,size_t __n)

{
  ssize_t extraout_RAX;
  ssize_t extraout_RAX_00;
  ssize_t extraout_RAX_01;
  ssize_t extraout_RAX_02;
  ssize_t sVar1;
  shared_ptr<webfront::http::Connection<webfront::networking::TCPNetworkingTS,_webfront::fs::Multi<webfront::fs::NativeDebugFS,_webfront::fs::IndexFS,_webfront::fs::ReactFS,_webfront::fs::BabelFS>_>_>
  self;
  element_type *local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_40;
  completion_handler_type local_38;
  vector<std::experimental::net::v1::const_buffer,_std::allocator<std::experimental::net::v1::const_buffer>_>
  local_20;
  
  ::std::
  __shared_ptr<webfront::http::Connection<webfront::networking::TCPNetworkingTS,webfront::fs::Multi<webfront::fs::NativeDebugFS,webfront::fs::IndexFS,webfront::fs::ReactFS,webfront::fs::BabelFS>>,(__gnu_cxx::_Lock_policy)2>
  ::
  __shared_ptr<webfront::http::Connection<webfront::networking::TCPNetworkingTS,webfront::fs::Multi<webfront::fs::NativeDebugFS,webfront::fs::IndexFS,webfront::fs::ReactFS,webfront::fs::BabelFS>>,void>
            ((__shared_ptr<webfront::http::Connection<webfront::networking::TCPNetworkingTS,webfront::fs::Multi<webfront::fs::NativeDebugFS,webfront::fs::IndexFS,webfront::fs::ReactFS,webfront::fs::BabelFS>>,(__gnu_cxx::_Lock_policy)2>
              *)&local_48,
             (__weak_ptr<webfront::http::Connection<webfront::networking::TCPNetworkingTS,_webfront::fs::Multi<webfront::fs::NativeDebugFS,_webfront::fs::IndexFS,_webfront::fs::ReactFS,_webfront::fs::BabelFS>_>,_(__gnu_cxx::_Lock_policy)2>
              *)this);
  Response::toBuffers<webfront::networking::TCPNetworkingTS>(&local_20,&this->response);
  local_38.self.
  super___shared_ptr<webfront::http::Connection<webfront::networking::TCPNetworkingTS,_webfront::fs::Multi<webfront::fs::NativeDebugFS,_webfront::fs::IndexFS,_webfront::fs::ReactFS,_webfront::fs::BabelFS>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = local_48;
  local_38.self.
  super___shared_ptr<webfront::http::Connection<webfront::networking::TCPNetworkingTS,_webfront::fs::Multi<webfront::fs::NativeDebugFS,_webfront::fs::IndexFS,_webfront::fs::ReactFS,_webfront::fs::BabelFS>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = local_40;
  if (local_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_40->_M_use_count = local_40->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_40->_M_use_count = local_40->_M_use_count + 1;
    }
  }
  local_38.this = this;
  networking::TCPNetworkingTS::
  AsyncWrite<std::experimental::net::v1::basic_stream_socket<std::experimental::net::v1::ip::tcp>&,std::vector<std::experimental::net::v1::const_buffer,std::allocator<std::experimental::net::v1::const_buffer>>,webfront::http::Connection<webfront::networking::TCPNetworkingTS,webfront::fs::Multi<webfront::fs::NativeDebugFS,webfront::fs::IndexFS,webfront::fs::ReactFS,webfront::fs::BabelFS>>::write()::_lambda(std::error_code,unsigned_long)_1_>
            (&this->socket,&local_20,&local_38);
  sVar1 = extraout_RAX;
  if (local_38.self.
      super___shared_ptr<webfront::http::Connection<webfront::networking::TCPNetworkingTS,_webfront::fs::Multi<webfront::fs::NativeDebugFS,_webfront::fs::IndexFS,_webfront::fs::ReactFS,_webfront::fs::BabelFS>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_38.self.
               super___shared_ptr<webfront::http::Connection<webfront::networking::TCPNetworkingTS,_webfront::fs::Multi<webfront::fs::NativeDebugFS,_webfront::fs::IndexFS,_webfront::fs::ReactFS,_webfront::fs::BabelFS>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
    sVar1 = extraout_RAX_00;
  }
  if (local_20.
      super__Vector_base<std::experimental::net::v1::const_buffer,_std::allocator<std::experimental::net::v1::const_buffer>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_20.
                    super__Vector_base<std::experimental::net::v1::const_buffer,_std::allocator<std::experimental::net::v1::const_buffer>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_20.
                          super__Vector_base<std::experimental::net::v1::const_buffer,_std::allocator<std::experimental::net::v1::const_buffer>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_20.
                          super__Vector_base<std::experimental::net::v1::const_buffer,_std::allocator<std::experimental::net::v1::const_buffer>_>
                          ._M_impl.super__Vector_impl_data._M_start);
    sVar1 = extraout_RAX_01;
  }
  if (local_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_40);
    sVar1 = extraout_RAX_02;
  }
  return sVar1;
}

Assistant:

void write() {
        auto self(this->shared_from_this());
        Net::AsyncWrite(socket, response.toBuffers<Net>(), [this, self](std::error_code ec, std::size_t /*bytesTransferred*/) {
            if (protocol == Protocol::HTTPUpgrading) {
                protocol = Protocol::WebSocket;
                if (onUpgrade) onUpgrade(std::move(socket), protocol);
            }
            else {
                if (!ec) socket.shutdown(Net::Socket::shutdown_both);
                if (ec != Net::Error::OperationAborted) connections.stop(self);
            }
        });
    }